

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

void __thiscall node::NodeContext::NodeContext(NodeContext *this)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(this,0,200);
  (this->rpc_interruption_point)._M_invoker =
       std::
       _Function_handler<void_(),_node::NodeContext::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/context.h:82:52)>
       ::_M_invoke;
  (this->rpc_interruption_point).super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_node::NodeContext::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/context.h:82:52)>
       ::_M_manager;
  (this->exit_status).super___atomic_base<int>._M_i = 0;
  (this->notifications)._M_t.
  super___uniq_ptr_impl<node::KernelNotifications,_std::default_delete<node::KernelNotifications>_>.
  _M_t.
  super__Tuple_impl<0UL,_node::KernelNotifications_*,_std::default_delete<node::KernelNotifications>_>
  .super__Head_base<0UL,_node::KernelNotifications_*,_false>._M_head_impl =
       (KernelNotifications *)0x0;
  (this->validation_signals)._M_t.
  super___uniq_ptr_impl<ValidationSignals,_std::default_delete<ValidationSignals>_>._M_t.
  super__Tuple_impl<0UL,_ValidationSignals_*,_std::default_delete<ValidationSignals>_>.
  super__Head_base<0UL,_ValidationSignals_*,_false>._M_head_impl = (ValidationSignals *)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    (this->warnings)._M_t.
    super___uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_>._M_t.
    super__Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>.
    super__Head_base<0UL,_node::Warnings_*,_false>._M_head_impl = (Warnings *)0x0;
    (this->background_init_thread)._M_id._M_thread = 0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

NodeContext::NodeContext() = default;